

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O1

void ncnn::im2col_sgemm_pack4to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  int iVar4;
  uint _h;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  int *piVar30;
  int nn;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  _func_int ***ppp_Var35;
  undefined1 (*pauVar36) [64];
  undefined1 (*pauVar37) [64];
  ulong uVar38;
  undefined1 (*pauVar39) [64];
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  float zeros [16];
  Mat local_d8;
  ulong local_88;
  void *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar32 = (ulong)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_88 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  iVar42 = iVar4 << 4;
  if ((long)uVar32 < 0x10) {
    iVar42 = iVar4;
  }
  local_d8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  uVar43 = (uVar3 & 0xf) + (uVar3 >> 4);
  if ((long)uVar32 < 0x10) {
    uVar43 = uVar3;
  }
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.c = local_d8.elempack;
  Mat::create(&local_d8,iVar42,_h,uVar43,0x10,4,opt->workspace_allocator);
  if (0 < (int)uVar3 >> 4) {
    lVar31 = 0x80;
    uVar34 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var35 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar34 *
                    CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
        uVar38 = 0;
        do {
          if (0 < iVar4) {
            pauVar40 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar38 + lVar31);
            iVar42 = iVar4;
            do {
              auVar47 = vunpcklps_avx512vl(pauVar40[-8],pauVar40[-7]);
              auVar48 = vunpcklps_avx512vl(pauVar40[-6],pauVar40[-5]);
              auVar5 = vunpckhps_avx(pauVar40[-8],pauVar40[-7]);
              auVar6 = vunpckhps_avx(pauVar40[-6],pauVar40[-5]);
              auVar9 = vmovlhps_avx512f(auVar47,auVar48);
              auVar49 = vunpckhpd_avx512vl(auVar47,auVar48);
              auVar10 = vmovlhps_avx512f(auVar5,auVar6);
              auVar48 = vunpckhpd_avx(auVar5,auVar6);
              auVar5 = vunpcklps_avx(pauVar40[-4],pauVar40[-3]);
              auVar50 = vunpcklps_avx512vl(pauVar40[-2],pauVar40[-1]);
              auVar6 = vunpckhps_avx(pauVar40[-4],pauVar40[-3]);
              auVar47 = vunpckhps_avx(pauVar40[-2],pauVar40[-1]);
              auVar11 = vmovlhps_avx512f(auVar5,auVar50);
              auVar51 = vunpckhpd_avx512vl(auVar5,auVar50);
              auVar5 = vmovlhps_avx(auVar6,auVar47);
              auVar50 = vunpckhpd_avx(auVar6,auVar47);
              auVar6 = vunpcklps_avx(*pauVar40,pauVar40[1]);
              auVar52 = vunpcklps_avx512vl(pauVar40[2],pauVar40[3]);
              auVar47 = vunpckhps_avx(*pauVar40,pauVar40[1]);
              auVar7 = vunpckhps_avx(pauVar40[2],pauVar40[3]);
              auVar12 = vmovlhps_avx512f(auVar6,auVar52);
              auVar53 = vunpckhpd_avx512vl(auVar6,auVar52);
              auVar6 = vmovlhps_avx(auVar47,auVar7);
              auVar7 = vunpckhpd_avx(auVar47,auVar7);
              auVar47 = vunpcklps_avx(pauVar40[4],pauVar40[5]);
              auVar54 = vunpcklps_avx512vl(pauVar40[6],pauVar40[7]);
              auVar52 = vunpckhps_avx(pauVar40[4],pauVar40[5]);
              auVar8 = vunpckhps_avx(pauVar40[6],pauVar40[7]);
              auVar13 = vmovlhps_avx512f(auVar47,auVar54);
              auVar54 = vunpckhpd_avx512vl(auVar47,auVar54);
              auVar47 = vmovlhps_avx(auVar52,auVar8);
              auVar52 = vunpckhpd_avx(auVar52,auVar8);
              *(undefined1 (*) [16])ppp_Var35 = auVar9;
              *(undefined1 (*) [16])(ppp_Var35 + 2) = auVar11;
              *(undefined1 (*) [16])(ppp_Var35 + 4) = auVar12;
              *(undefined1 (*) [16])(ppp_Var35 + 6) = auVar13;
              *(undefined1 (*) [16])(ppp_Var35 + 8) = auVar49;
              *(undefined1 (*) [16])(ppp_Var35 + 10) = auVar51;
              *(undefined1 (*) [16])(ppp_Var35 + 0xc) = auVar53;
              *(undefined1 (*) [16])(ppp_Var35 + 0xe) = auVar54;
              *(undefined1 (*) [16])(ppp_Var35 + 0x10) = auVar10;
              *(undefined1 (*) [16])(ppp_Var35 + 0x12) = auVar5;
              *(undefined1 (*) [16])(ppp_Var35 + 0x14) = auVar6;
              *(undefined1 (*) [16])(ppp_Var35 + 0x16) = auVar47;
              *(undefined1 (*) [16])(ppp_Var35 + 0x18) = auVar48;
              *(undefined1 (*) [16])(ppp_Var35 + 0x1a) = auVar50;
              *(undefined1 (*) [16])(ppp_Var35 + 0x1c) = auVar7;
              *(undefined1 (*) [16])(ppp_Var35 + 0x1e) = auVar52;
              ppp_Var35 = ppp_Var35 + 0x20;
              pauVar40 = (undefined1 (*) [16])(*pauVar40 + (long)(int)(uVar3 * 4) * 4);
              iVar42 = iVar42 + -1;
            } while (iVar42 != 0);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != _h);
      }
      uVar34 = uVar34 + 1;
      lVar31 = lVar31 + 0x100;
    } while (uVar34 != (uint)((int)uVar3 >> 4));
  }
  uVar34 = uVar32 & 0xfffffffffffffff0;
  if ((uint)uVar34 != uVar3) {
    lVar31 = uVar34 << 4;
    do {
      if (0 < (int)_h) {
        uVar43 = (uint)uVar34;
        uVar33 = uVar43 + 0xf;
        if (-1 < (int)uVar43) {
          uVar33 = uVar43;
        }
        ppp_Var35 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    (long)(int)(((int)uVar33 >> 4) + (uVar43 - (uVar33 & 0xfffffff0))) *
                    local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
                    );
        uVar38 = 0;
        do {
          if (0 < iVar4) {
            pauVar40 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar38 + lVar31);
            iVar42 = iVar4;
            do {
              *(undefined1 (*) [16])ppp_Var35 = *pauVar40;
              ppp_Var35 = ppp_Var35 + 2;
              pauVar40 = (undefined1 (*) [16])(*pauVar40 + (long)(int)(uVar3 * 4) * 4);
              iVar42 = iVar42 + -1;
            } while (iVar42 != 0);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != _h);
      }
      uVar34 = uVar34 + 1;
      lVar31 = lVar31 + 0x10;
    } while ((long)uVar34 < (long)uVar32);
  }
  if (0 < (int)local_88) {
    iVar42 = _h * iVar4 * 4;
    uVar34 = 0;
    do {
      pauVar36 = (undefined1 (*) [64])
                 (top_blob->cstep * uVar34 * top_blob->elemsize + (long)top_blob->data);
      pauVar37 = (undefined1 (*) [64])(uVar34 * 0x40 + (long)local_80);
      if (local_80 == (void *)0x0) {
        pauVar37 = (undefined1 (*) [64])&local_78;
      }
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 0x10) {
        uVar38 = 0;
      }
      else {
        lVar31 = 0;
        uVar41 = 0;
        do {
          auVar55 = *pauVar37;
          auVar70 = auVar55;
          auVar69 = auVar55;
          auVar68 = auVar55;
          auVar67 = auVar55;
          auVar66 = auVar55;
          auVar65 = auVar55;
          auVar64 = auVar55;
          auVar63 = auVar55;
          auVar62 = auVar55;
          auVar61 = auVar55;
          auVar60 = auVar55;
          auVar59 = auVar55;
          auVar58 = auVar55;
          auVar57 = auVar55;
          auVar56 = auVar55;
          if (0 < (int)(_h * iVar4 * 4)) {
            lVar44 = local_d8.cstep *
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * lVar31;
            lVar46 = 0;
            iVar45 = iVar42;
            do {
              auVar2 = *(undefined1 (*) [64])
                        ((long)kernel->data + lVar46 + kernel->cstep * uVar34 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar46 + lVar44);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar55 = vfmadd231ps_avx512f(auVar55,auVar2,auVar14);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar46 + lVar44 + 4);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar56 = vfmadd231ps_avx512f(auVar56,auVar2,auVar15);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar16._4_4_ = uVar1;
              auVar16._0_4_ = uVar1;
              auVar16._8_4_ = uVar1;
              auVar16._12_4_ = uVar1;
              auVar16._16_4_ = uVar1;
              auVar16._20_4_ = uVar1;
              auVar16._24_4_ = uVar1;
              auVar16._28_4_ = uVar1;
              auVar16._32_4_ = uVar1;
              auVar16._36_4_ = uVar1;
              auVar16._40_4_ = uVar1;
              auVar16._44_4_ = uVar1;
              auVar16._48_4_ = uVar1;
              auVar16._52_4_ = uVar1;
              auVar16._56_4_ = uVar1;
              auVar16._60_4_ = uVar1;
              auVar57 = vfmadd231ps_avx512f(auVar57,auVar2,auVar16);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar17._4_4_ = uVar1;
              auVar17._0_4_ = uVar1;
              auVar17._8_4_ = uVar1;
              auVar17._12_4_ = uVar1;
              auVar17._16_4_ = uVar1;
              auVar17._20_4_ = uVar1;
              auVar17._24_4_ = uVar1;
              auVar17._28_4_ = uVar1;
              auVar17._32_4_ = uVar1;
              auVar17._36_4_ = uVar1;
              auVar17._40_4_ = uVar1;
              auVar17._44_4_ = uVar1;
              auVar17._48_4_ = uVar1;
              auVar17._52_4_ = uVar1;
              auVar17._56_4_ = uVar1;
              auVar17._60_4_ = uVar1;
              auVar58 = vfmadd231ps_avx512f(auVar58,auVar2,auVar17);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x10))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar18._4_4_ = uVar1;
              auVar18._0_4_ = uVar1;
              auVar18._8_4_ = uVar1;
              auVar18._12_4_ = uVar1;
              auVar18._16_4_ = uVar1;
              auVar18._20_4_ = uVar1;
              auVar18._24_4_ = uVar1;
              auVar18._28_4_ = uVar1;
              auVar18._32_4_ = uVar1;
              auVar18._36_4_ = uVar1;
              auVar18._40_4_ = uVar1;
              auVar18._44_4_ = uVar1;
              auVar18._48_4_ = uVar1;
              auVar18._52_4_ = uVar1;
              auVar18._56_4_ = uVar1;
              auVar18._60_4_ = uVar1;
              auVar59 = vfmadd231ps_avx512f(auVar59,auVar2,auVar18);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x10))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar19._4_4_ = uVar1;
              auVar19._0_4_ = uVar1;
              auVar19._8_4_ = uVar1;
              auVar19._12_4_ = uVar1;
              auVar19._16_4_ = uVar1;
              auVar19._20_4_ = uVar1;
              auVar19._24_4_ = uVar1;
              auVar19._28_4_ = uVar1;
              auVar19._32_4_ = uVar1;
              auVar19._36_4_ = uVar1;
              auVar19._40_4_ = uVar1;
              auVar19._44_4_ = uVar1;
              auVar19._48_4_ = uVar1;
              auVar19._52_4_ = uVar1;
              auVar19._56_4_ = uVar1;
              auVar19._60_4_ = uVar1;
              auVar60 = vfmadd231ps_avx512f(auVar60,auVar2,auVar19);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x18))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar20._4_4_ = uVar1;
              auVar20._0_4_ = uVar1;
              auVar20._8_4_ = uVar1;
              auVar20._12_4_ = uVar1;
              auVar20._16_4_ = uVar1;
              auVar20._20_4_ = uVar1;
              auVar20._24_4_ = uVar1;
              auVar20._28_4_ = uVar1;
              auVar20._32_4_ = uVar1;
              auVar20._36_4_ = uVar1;
              auVar20._40_4_ = uVar1;
              auVar20._44_4_ = uVar1;
              auVar20._48_4_ = uVar1;
              auVar20._52_4_ = uVar1;
              auVar20._56_4_ = uVar1;
              auVar20._60_4_ = uVar1;
              auVar61 = vfmadd231ps_avx512f(auVar61,auVar2,auVar20);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x18))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar21._4_4_ = uVar1;
              auVar21._0_4_ = uVar1;
              auVar21._8_4_ = uVar1;
              auVar21._12_4_ = uVar1;
              auVar21._16_4_ = uVar1;
              auVar21._20_4_ = uVar1;
              auVar21._24_4_ = uVar1;
              auVar21._28_4_ = uVar1;
              auVar21._32_4_ = uVar1;
              auVar21._36_4_ = uVar1;
              auVar21._40_4_ = uVar1;
              auVar21._44_4_ = uVar1;
              auVar21._48_4_ = uVar1;
              auVar21._52_4_ = uVar1;
              auVar21._56_4_ = uVar1;
              auVar21._60_4_ = uVar1;
              auVar62 = vfmadd231ps_avx512f(auVar62,auVar2,auVar21);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x20))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar22._4_4_ = uVar1;
              auVar22._0_4_ = uVar1;
              auVar22._8_4_ = uVar1;
              auVar22._12_4_ = uVar1;
              auVar22._16_4_ = uVar1;
              auVar22._20_4_ = uVar1;
              auVar22._24_4_ = uVar1;
              auVar22._28_4_ = uVar1;
              auVar22._32_4_ = uVar1;
              auVar22._36_4_ = uVar1;
              auVar22._40_4_ = uVar1;
              auVar22._44_4_ = uVar1;
              auVar22._48_4_ = uVar1;
              auVar22._52_4_ = uVar1;
              auVar22._56_4_ = uVar1;
              auVar22._60_4_ = uVar1;
              auVar63 = vfmadd231ps_avx512f(auVar63,auVar2,auVar22);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x20))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar23._4_4_ = uVar1;
              auVar23._0_4_ = uVar1;
              auVar23._8_4_ = uVar1;
              auVar23._12_4_ = uVar1;
              auVar23._16_4_ = uVar1;
              auVar23._20_4_ = uVar1;
              auVar23._24_4_ = uVar1;
              auVar23._28_4_ = uVar1;
              auVar23._32_4_ = uVar1;
              auVar23._36_4_ = uVar1;
              auVar23._40_4_ = uVar1;
              auVar23._44_4_ = uVar1;
              auVar23._48_4_ = uVar1;
              auVar23._52_4_ = uVar1;
              auVar23._56_4_ = uVar1;
              auVar23._60_4_ = uVar1;
              auVar64 = vfmadd231ps_avx512f(auVar64,auVar2,auVar23);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x28))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar24._4_4_ = uVar1;
              auVar24._0_4_ = uVar1;
              auVar24._8_4_ = uVar1;
              auVar24._12_4_ = uVar1;
              auVar24._16_4_ = uVar1;
              auVar24._20_4_ = uVar1;
              auVar24._24_4_ = uVar1;
              auVar24._28_4_ = uVar1;
              auVar24._32_4_ = uVar1;
              auVar24._36_4_ = uVar1;
              auVar24._40_4_ = uVar1;
              auVar24._44_4_ = uVar1;
              auVar24._48_4_ = uVar1;
              auVar24._52_4_ = uVar1;
              auVar24._56_4_ = uVar1;
              auVar24._60_4_ = uVar1;
              auVar65 = vfmadd231ps_avx512f(auVar65,auVar2,auVar24);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x28))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar25._32_4_ = uVar1;
              auVar25._36_4_ = uVar1;
              auVar25._40_4_ = uVar1;
              auVar25._44_4_ = uVar1;
              auVar25._48_4_ = uVar1;
              auVar25._52_4_ = uVar1;
              auVar25._56_4_ = uVar1;
              auVar25._60_4_ = uVar1;
              auVar66 = vfmadd231ps_avx512f(auVar66,auVar2,auVar25);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x30))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar26._32_4_ = uVar1;
              auVar26._36_4_ = uVar1;
              auVar26._40_4_ = uVar1;
              auVar26._44_4_ = uVar1;
              auVar26._48_4_ = uVar1;
              auVar26._52_4_ = uVar1;
              auVar26._56_4_ = uVar1;
              auVar26._60_4_ = uVar1;
              auVar67 = vfmadd231ps_avx512f(auVar67,auVar2,auVar26);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x30))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar27._32_4_ = uVar1;
              auVar27._36_4_ = uVar1;
              auVar27._40_4_ = uVar1;
              auVar27._44_4_ = uVar1;
              auVar27._48_4_ = uVar1;
              auVar27._52_4_ = uVar1;
              auVar27._56_4_ = uVar1;
              auVar27._60_4_ = uVar1;
              auVar68 = vfmadd231ps_avx512f(auVar68,auVar2,auVar27);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x38))->_vptr_Allocator +
                       lVar46 + lVar44);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar28._32_4_ = uVar1;
              auVar28._36_4_ = uVar1;
              auVar28._40_4_ = uVar1;
              auVar28._44_4_ = uVar1;
              auVar28._48_4_ = uVar1;
              auVar28._52_4_ = uVar1;
              auVar28._56_4_ = uVar1;
              auVar28._60_4_ = uVar1;
              auVar69 = vfmadd231ps_avx512f(auVar69,auVar2,auVar28);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x38))->_vptr_Allocator +
                       lVar46 + lVar44 + 4);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              auVar29._32_4_ = uVar1;
              auVar29._36_4_ = uVar1;
              auVar29._40_4_ = uVar1;
              auVar29._44_4_ = uVar1;
              auVar29._48_4_ = uVar1;
              auVar29._52_4_ = uVar1;
              auVar29._56_4_ = uVar1;
              auVar29._60_4_ = uVar1;
              auVar70 = vfmadd231ps_avx512f(auVar70,auVar2,auVar29);
              lVar46 = lVar46 + 0x40;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
          *pauVar36 = auVar55;
          pauVar36[1] = auVar56;
          pauVar36[2] = auVar57;
          pauVar36[3] = auVar58;
          pauVar36[4] = auVar59;
          pauVar36[5] = auVar60;
          pauVar36[6] = auVar61;
          pauVar36[7] = auVar62;
          pauVar36[8] = auVar63;
          pauVar36[9] = auVar64;
          pauVar36[10] = auVar65;
          pauVar36[0xb] = auVar66;
          pauVar36[0xc] = auVar67;
          pauVar36[0xd] = auVar68;
          pauVar36[0xe] = auVar69;
          pauVar36[0xf] = auVar70;
          pauVar36 = pauVar36 + 0x10;
          uVar38 = uVar41 + 0x10;
          lVar44 = uVar41 + 0x1f;
          lVar31 = lVar31 + 1;
          uVar41 = uVar38;
        } while (lVar44 < (long)uVar32);
      }
      if ((int)uVar38 < (int)uVar3) {
        do {
          auVar55 = *pauVar37;
          if (0 < (int)(_h * iVar4 * 4)) {
            pauVar39 = (undefined1 (*) [64])
                       (kernel->cstep * uVar34 * kernel->elemsize + (long)kernel->data);
            lVar31 = 0;
            do {
              auVar70 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)(_func_int ***)local_d8.data +
                                                    lVar31 * 4 +
                                                    local_d8.cstep *
                                                    CONCAT44(local_d8.elemsize._4_4_,
                                                             (undefined4)local_d8.elemsize) *
                                                    (ulong)(((uint)uVar38 & 0xf) +
                                                           ((uint)(uVar38 >> 4) & 0xfffffff)))));
              auVar55 = vfmadd231ps_avx512f(auVar55,auVar70,*pauVar39);
              pauVar39 = pauVar39 + 1;
              lVar31 = lVar31 + 1;
            } while (iVar42 != (int)lVar31);
          }
          *pauVar36 = auVar55;
          pauVar36 = pauVar36 + 1;
          uVar43 = (uint)uVar38 + 1;
          uVar38 = (ulong)uVar43;
        } while (uVar43 != uVar3);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != local_88);
  }
  piVar30 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 16)
        tmp.create(16 * maxk, inch, size / 16 + size % 16, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 4;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 16;

            float* tmpptr = tmp.channel(i / 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x16
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);
                    __m128 _rc = _mm_load_ps(img0 + 4 * 12);
                    __m128 _rd = _mm_load_ps(img0 + 4 * 13);
                    __m128 _re = _mm_load_ps(img0 + 4 * 14);
                    __m128 _rf = _mm_load_ps(img0 + 4 * 15);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _rc);
                    _mm_store_ps(tmpptr + 4 * 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 5, _r5);
                    _mm_store_ps(tmpptr + 4 * 6, _r9);
                    _mm_store_ps(tmpptr + 4 * 7, _rd);
                    _mm_store_ps(tmpptr + 4 * 8, _r2);
                    _mm_store_ps(tmpptr + 4 * 9, _r6);
                    _mm_store_ps(tmpptr + 4 * 10, _ra);
                    _mm_store_ps(tmpptr + 4 * 11, _re);
                    _mm_store_ps(tmpptr + 4 * 12, _r3);
                    _mm_store_ps(tmpptr + 4 * 13, _r7);
                    _mm_store_ps(tmpptr + 4 * 14, _rb);
                    _mm_store_ps(tmpptr + 4 * 15, _rf);

                    img0 += size * 4;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 15 < size; i += 16)
        {
            float* tmpptr = tmp.channel(i / 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;
            __m512 _sum8 = _sum0;
            __m512 _sum9 = _sum0;
            __m512 _suma = _sum0;
            __m512 _sumb = _sum0;
            __m512 _sumc = _sum0;
            __m512 _sumd = _sum0;
            __m512 _sume = _sum0;
            __m512 _sumf = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);
                __m512 _val8 = _mm512_set1_ps(tmpptr[8]);
                __m512 _val9 = _mm512_set1_ps(tmpptr[9]);
                _sum8 = _mm512_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm512_fmadd_ps(_val9, _w0, _sum9);
                __m512 _vala = _mm512_set1_ps(tmpptr[10]);
                __m512 _valb = _mm512_set1_ps(tmpptr[11]);
                _suma = _mm512_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm512_fmadd_ps(_valb, _w0, _sumb);
                __m512 _valc = _mm512_set1_ps(tmpptr[12]);
                __m512 _vald = _mm512_set1_ps(tmpptr[13]);
                _sumc = _mm512_fmadd_ps(_valc, _w0, _sumc);
                _sumd = _mm512_fmadd_ps(_vald, _w0, _sumd);
                __m512 _vale = _mm512_set1_ps(tmpptr[14]);
                __m512 _valf = _mm512_set1_ps(tmpptr[15]);
                _sume = _mm512_fmadd_ps(_vale, _w0, _sume);
                _sumf = _mm512_fmadd_ps(_valf, _w0, _sumf);

                kptr += 16;
                tmpptr += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            _mm512_store_ps(outptr0 + 16 * 8, _sum8);
            _mm512_store_ps(outptr0 + 16 * 9, _sum9);
            _mm512_store_ps(outptr0 + 16 * 10, _suma);
            _mm512_store_ps(outptr0 + 16 * 11, _sumb);
            _mm512_store_ps(outptr0 + 16 * 12, _sumc);
            _mm512_store_ps(outptr0 + 16 * 13, _sumd);
            _mm512_store_ps(outptr0 + 16 * 14, _sume);
            _mm512_store_ps(outptr0 + 16 * 15, _sumf);

            outptr0 += 16 * 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}